

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O2

void __thiscall glslang::HlslParseContext::fixBuiltInIoType(HlslParseContext *this,TType *type)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  TBasicType t;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  TArraySizes *this_00;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  long lVar5;
  TType *s;
  undefined8 *puVar6;
  TQualifier *pTVar7;
  uint uVar8;
  uint uVar9;
  byte bVar10;
  TType newType;
  
  bVar10 = 0;
  s = type;
  iVar2 = (*type->_vptr_TType[10])(type);
  uVar3 = *(uint *)(CONCAT44(extraout_var,iVar2) + 8) >> 7 & 0x1ff;
  if (uVar3 - 3 < 3) {
LAB_00313265:
    t = (*type->_vptr_TType[7])(type);
    iVar2 = (*type->_vptr_TType[10])(type);
    TType::TType(&newType,t,*(TStorageQualifier *)(CONCAT44(extraout_var_00,iVar2) + 8) & 0x7f,3,0,0
                 ,false);
    iVar2 = (*type->_vptr_TType[10])(type);
    puVar6 = (undefined8 *)CONCAT44(extraout_var_01,iVar2);
    pTVar7 = &newType.qualifier;
    for (lVar5 = 10; lVar5 != 0; lVar5 = lVar5 + -1) {
      pTVar7->semanticName = (char *)*puVar6;
      puVar6 = puVar6 + (ulong)bVar10 * -2 + 1;
      pTVar7 = (TQualifier *)((long)pTVar7 + (ulong)bVar10 * -0x10 + 8);
    }
    TType::shallowCopy(type,&newType);
  }
  else {
    if (uVar3 == 0x38) {
      iVar2 = 4;
    }
    else if (uVar3 == 0x47) {
      iVar2 = (*type->_vptr_TType[0x1d])(type);
      if ((char)iVar2 != '\0') {
        return;
      }
      iVar2 = 1;
    }
    else {
      if (uVar3 == 0x3b) goto LAB_00313265;
      if (uVar3 != 0x39) {
        bVar1 = isClipOrCullDistance(type);
        if (!bVar1) {
          return;
        }
        iVar2 = (*type->_vptr_TType[10])(type);
        uVar9 = (uint)*(undefined8 *)(CONCAT44(extraout_var_02,iVar2) + 0x1c) & 0xfff;
        iVar2 = (*type->_vptr_TType[10])(type);
        uVar3 = *(uint *)(CONCAT44(extraout_var_03,iVar2) + 8);
        iVar2 = (*type->_vptr_TType[10])(type);
        uVar8 = (uint)*(undefined8 *)(CONCAT44(extraout_var_04,iVar2) + 8) & 0x7f;
        iVar2 = (*type->_vptr_TType[0xc])(type);
        if ((uVar3 & 0xff80) == 0x1080) {
          if (uVar8 == 3) {
            (this->clipSemanticNSizeIn)._M_elems[uVar9] = iVar2;
            return;
          }
          (this->clipSemanticNSizeOut)._M_elems[uVar9] = iVar2;
          return;
        }
        if (uVar8 == 3) {
          (this->cullSemanticNSizeIn)._M_elems[uVar9] = iVar2;
          return;
        }
        (this->cullSemanticNSizeOut)._M_elems[uVar9] = iVar2;
        return;
      }
      iVar2 = 2;
    }
    iVar4 = (*type->_vptr_TType[0x1d])(type);
    if (((char)iVar4 == '\0') || (iVar4 = (*type->_vptr_TType[0xf])(type), iVar4 != iVar2)) {
      this_00 = (TArraySizes *)TArraySizes::operator_new((TArraySizes *)0x18,(size_t)s);
      (this_00->sizes)._vptr_TSmallArrayVector = (_func_int **)&PTR__TSmallArrayVector_0089abd8;
      (this_00->sizes).sizes = (TVector<glslang::TArraySize> *)0x0;
      this_00->implicitArraySize = 0;
      this_00->implicitlySized = true;
      this_00->variablyIndexed = false;
      TArraySizes::addInnerSize(this_00,iVar2);
      type->arraySizes = this_00;
    }
  }
  return;
}

Assistant:

void HlslParseContext::fixBuiltInIoType(TType& type)
{
    int requiredArraySize = 0;
    int requiredVectorSize = 0;

    switch (type.getQualifier().builtIn) {
    case EbvTessLevelOuter: requiredArraySize = 4; break;
    case EbvTessLevelInner: requiredArraySize = 2; break;

    case EbvSampleMask:
        {
            // Promote scalar to array of size 1.  Leave existing arrays alone.
            if (!type.isArray())
                requiredArraySize = 1;
            break;
        }

    case EbvWorkGroupId:        requiredVectorSize = 3; break;
    case EbvGlobalInvocationId: requiredVectorSize = 3; break;
    case EbvLocalInvocationId:  requiredVectorSize = 3; break;
    case EbvTessCoord:          requiredVectorSize = 3; break;

    default:
        if (isClipOrCullDistance(type)) {
            const int loc = type.getQualifier().layoutLocation;

            if (type.getQualifier().builtIn == EbvClipDistance) {
                if (type.getQualifier().storage == EvqVaryingIn)
                    clipSemanticNSizeIn[loc] = type.getVectorSize();
                else
                    clipSemanticNSizeOut[loc] = type.getVectorSize();
            } else {
                if (type.getQualifier().storage == EvqVaryingIn)
                    cullSemanticNSizeIn[loc] = type.getVectorSize();
                else
                    cullSemanticNSizeOut[loc] = type.getVectorSize();
            }
        }

        return;
    }

    // Alter or set vector size as needed.
    if (requiredVectorSize > 0) {
        TType newType(type.getBasicType(), type.getQualifier().storage, requiredVectorSize);
        newType.getQualifier() = type.getQualifier();

        type.shallowCopy(newType);
    }

    // Alter or set array size as needed.
    if (requiredArraySize > 0) {
        if (!type.isArray() || type.getOuterArraySize() != requiredArraySize) {
            TArraySizes* arraySizes = new TArraySizes;
            arraySizes->addInnerSize(requiredArraySize);
            type.transferArraySizes(arraySizes);
        }
    }
}